

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void youngcollection(lua_State *L,global_State *g)

{
  GCObject *local_28;
  GCObject *dummy;
  GCObject **psurvival;
  global_State *g_local;
  lua_State *L_local;
  
  psurvival = (GCObject **)g;
  g_local = (global_State *)L;
  if (g->gcstate == '\0') {
    if (g->firstold1 != (GCObject *)0x0) {
      markold(g,g->firstold1,g->reallyold);
      psurvival[0x19] = (GCObject *)0x0;
    }
    markold((global_State *)psurvival,psurvival[0xe],psurvival[0x1c]);
    markold((global_State *)psurvival,psurvival[0x14],(GCObject *)0x0);
    atomic((lua_State *)g_local);
    *(undefined1 *)((long)psurvival + 0x55) = 3;
    dummy = (GCObject *)
            sweepgen((lua_State *)g_local,(global_State *)psurvival,psurvival + 0xc,psurvival[0x16],
                     psurvival + 0x19);
    sweepgen((lua_State *)g_local,(global_State *)psurvival,(GCObject **)dummy,psurvival[0x17],
             psurvival + 0x19);
    psurvival[0x18] = psurvival[0x17];
    psurvival[0x17] = dummy->next;
    psurvival[0x16] = psurvival[0xc];
    local_28 = (GCObject *)0x0;
    dummy = (GCObject *)
            sweepgen((lua_State *)g_local,(global_State *)psurvival,psurvival + 0xe,psurvival[0x1a],
                     &local_28);
    sweepgen((lua_State *)g_local,(global_State *)psurvival,(GCObject **)dummy,psurvival[0x1b],
             &local_28);
    psurvival[0x1c] = psurvival[0x1b];
    psurvival[0x1b] = dummy->next;
    psurvival[0x1a] = psurvival[0xe];
    sweepgen((lua_State *)g_local,(global_State *)psurvival,psurvival + 0x14,(GCObject *)0x0,
             &local_28);
    finishgencycle((lua_State *)g_local,(global_State *)psurvival);
    return;
  }
  __assert_fail("g->gcstate == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                ,0x540,"void youngcollection(lua_State *, global_State *)");
}

Assistant:

static void youngcollection (lua_State *L, global_State *g) {
  GCObject **psurvival;  /* to point to first non-dead survival object */
  GCObject *dummy;  /* dummy out parameter to 'sweepgen' */
  lua_assert(g->gcstate == GCSpropagate);
  if (g->firstold1) {  /* are there regular OLD1 objects? */
    markold(g, g->firstold1, g->reallyold);  /* mark them */
    g->firstold1 = NULL;  /* no more OLD1 objects (for now) */
  }
  markold(g, g->finobj, g->finobjrold);
  markold(g, g->tobefnz, NULL);
  atomic(L);

  /* sweep nursery and get a pointer to its last live element */
  g->gcstate = GCSswpallgc;
  psurvival = sweepgen(L, g, &g->allgc, g->survival, &g->firstold1);
  /* sweep 'survival' */
  sweepgen(L, g, psurvival, g->old1, &g->firstold1);
  g->reallyold = g->old1;
  g->old1 = *psurvival;  /* 'survival' survivals are old now */
  g->survival = g->allgc;  /* all news are survivals */

  /* repeat for 'finobj' lists */
  dummy = NULL;  /* no 'firstold1' optimization for 'finobj' lists */
  psurvival = sweepgen(L, g, &g->finobj, g->finobjsur, &dummy);
  /* sweep 'survival' */
  sweepgen(L, g, psurvival, g->finobjold1, &dummy);
  g->finobjrold = g->finobjold1;
  g->finobjold1 = *psurvival;  /* 'survival' survivals are old now */
  g->finobjsur = g->finobj;  /* all news are survivals */

  sweepgen(L, g, &g->tobefnz, NULL, &dummy);
  finishgencycle(L, g);
}